

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# micro_string.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::MicroString::SetString
          (MicroString *this,string *data,Arena *arena,size_t inline_capacity)

{
  bool bVar1;
  LargeRepKind LVar2;
  ulong uVar3;
  unsigned_long *puVar4;
  StringRep *local_38;
  StringRep *h;
  size_t local_28;
  size_t inline_capacity_local;
  Arena *arena_local;
  string *data_local;
  MicroString *this_local;
  
  local_28 = inline_capacity;
  inline_capacity_local = (size_t)arena;
  arena_local = (Arena *)data;
  data_local = (string *)this;
  uVar3 = std::__cxx11::string::size();
  h = (StringRep *)0x20;
  puVar4 = std::max<unsigned_long>(&local_28,(unsigned_long *)&h);
  if (*puVar4 < uVar3) {
    bVar1 = is_large_rep(this);
    if ((bVar1) && (LVar2 = large_rep_kind(this), LVar2 == kString)) {
      local_38 = string_rep(this);
    }
    else {
      if (inline_capacity_local == 0) {
        Destroy(this);
      }
      local_38 = AllocateStringRep(this,(Arena *)inline_capacity_local);
    }
    std::__cxx11::string::operator=((string *)&local_38->str,(string *)arena_local);
    StringRep::ResetBase(local_38);
  }
  else {
    Set<google::protobuf::Arena*,unsigned_long>
              (this,(string *)arena_local,(Arena *)inline_capacity_local,local_28);
  }
  return;
}

Assistant:

void MicroString::SetString(std::string&& data, Arena* arena,
                            size_t inline_capacity) {
  if (data.size() <= std::max(inline_capacity, size_t{32})) {
    // Just copy the data. The overhead of the string is not worth it.
    return Set(data, arena, inline_capacity);
  }

  StringRep* h;
  if (!is_large_rep() || large_rep_kind() != kString) {
    if (arena == nullptr) Destroy();
    h = AllocateStringRep(arena);
  } else {
    h = string_rep();
  }

  h->str = std::move(data);
  h->ResetBase();
}